

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O0

void __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::updateBoundingBox(KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                    *this,Node *node)

{
  bool bVar1;
  default_set<int> local_20;
  default_less<int> local_1f;
  default_set<int> local_1e;
  default_less<int> local_1d;
  uint local_1c;
  Node *pNStack_18;
  int d;
  Node *node_local;
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  *this_local;
  
  pNStack_18 = node;
  node_local = (Node *)this;
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    bVar1 = default_less<int>::operator()(&local_1d,pNStack_18->value,this->boundingBoxMin,local_1c)
    ;
    if (bVar1) {
      default_set<int>::operator()(&local_1e,this->boundingBoxMin,pNStack_18->value,local_1c);
    }
    else {
      bVar1 = default_less<int>::operator()
                        (&local_1f,this->boundingBoxMax,pNStack_18->value,local_1c);
      if (bVar1) {
        default_set<int>::operator()(&local_20,this->boundingBoxMax,pNStack_18->value,local_1c);
      }
    }
  }
  return;
}

Assistant:

void updateBoundingBox(const Node * const node) {
			for (int d = 0; d < dim; d++) {
				if (LESS()(node->value, boundingBoxMin, d)) {
					SET()(boundingBoxMin, node->value, d);
				}
				else if (LESS()(boundingBoxMax, node->value, d)) {
					SET()(boundingBoxMax, node->value, d);
				}
			}
		}